

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2R.cpp
# Opt level: O0

void __thiscall
OpenMD::P2Z::P2Z(P2Z *this,SimInfo *info,string *filename,string *sele1,int seleOffset,uint nbins,
                int axis)

{
  StaticAnalyser *in_RDI;
  undefined4 in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000014;
  string paramString;
  stringstream params;
  string *type;
  undefined4 in_stack_fffffffffffffd98;
  int iVar1;
  string local_260 [32];
  stringstream local_240 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [88];
  
  P2R::P2R((P2R *)paramString.field_2._8_8_,(SimInfo *)paramString.field_2._M_allocated_capacity,
           (string *)paramString._M_string_length,(string *)paramString._0_8_,in_stack_00000014,
           in_stack_00000010);
  in_RDI->_vptr_StaticAnalyser = (_func_int **)&PTR__P2Z_0055fc28;
  *(undefined4 *)((long)&in_RDI[0x11].dumpFilename_._M_string_length + 4) = in_stack_00000008;
  type = (string *)&in_RDI[0x11].dumpFilename_.field_2;
  std::__cxx11::string::string((string *)type);
  iVar1 = *(int *)((long)&in_RDI[0x11].dumpFilename_._M_string_length + 4);
  if (iVar1 == 0) {
    std::__cxx11::string::operator=((string *)in_RDI[0x11].dumpFilename_.field_2._M_local_buf,"x");
  }
  else if (iVar1 == 1) {
    std::__cxx11::string::operator=((string *)in_RDI[0x11].dumpFilename_.field_2._M_local_buf,"y");
  }
  else {
    std::__cxx11::string::operator=((string *)in_RDI[0x11].dumpFilename_.field_2._M_local_buf,"z");
  }
  std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar1,in_stack_fffffffffffffd98),(char *)in_RDI);
  StaticAnalyser::setAnalysisType(in_RDI,type);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  getPrefix((string *)CONCAT44(iVar1,in_stack_fffffffffffffd98));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar1,in_stack_fffffffffffffd98),(char *)in_RDI);
  StaticAnalyser::setOutputName(in_RDI,type);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::stringstream::stringstream(local_240);
  std::__cxx11::stringstream::str();
  StaticAnalyser::setParameterString(in_RDI,type);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::stringstream::~stringstream(local_240);
  return;
}

Assistant:

P2Z::P2Z(SimInfo* info, const std::string& filename, const std::string& sele1,
           int seleOffset, unsigned int nbins, int axis) :
      P2R(info, filename, sele1, seleOffset, nbins),
      axis_(axis) {
    switch (axis_) {
    case 0:
      axisLabel_ = "x";
      break;
    case 1:
      axisLabel_ = "y";
      break;
    case 2:
    default:
      axisLabel_ = "z";
      break;
    }

    setAnalysisType("2nd order Legendre Polynomial Correlation using " +
                    axisLabel_ + " as reference axis");
    setOutputName(getPrefix(filename) + ".P2Z");
    std::stringstream params;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }